

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonPatchFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  char *pcVar2;
  JsonNode *pNode;
  JsonParse *pJVar3;
  JsonParse local_78;
  JsonParse local_48;
  
  pJVar3 = &local_78;
  pcVar2 = (char *)sqlite3ValueText(*argv,'\x01');
  iVar1 = jsonParse(&local_78,ctx,pcVar2);
  if (iVar1 == 0) {
    pcVar2 = (char *)sqlite3ValueText(argv[1],'\x01');
    iVar1 = jsonParse(&local_48,ctx,pcVar2);
    if (iVar1 == 0) {
      pNode = jsonMergePatch(&local_78,0,local_48.aNode);
      if (pNode == (JsonNode *)0x0) {
        sqlite3_result_error_nomem(ctx);
      }
      else {
        jsonReturnJson(pNode,ctx,(sqlite3_value **)0x0);
      }
      sqlite3_free(local_78.aNode);
      local_78.nNode = 0;
      local_78.nAlloc = 0;
      local_78.aNode = (JsonNode *)0x0;
      sqlite3_free(local_78.aUp);
      local_78.aUp = (u32 *)0x0;
      pJVar3 = &local_48;
    }
    sqlite3_free(pJVar3->aNode);
    pJVar3->nNode = 0;
    pJVar3->nAlloc = 0;
    pJVar3->aNode = (JsonNode *)0x0;
    sqlite3_free(pJVar3->aUp);
  }
  return;
}

Assistant:

static void jsonPatchFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;     /* The JSON that is being patched */
  JsonParse y;     /* The patch */
  JsonNode *pResult;   /* The result of the merge */

  UNUSED_PARAM(argc);
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  if( jsonParse(&y, ctx, (const char*)sqlite3_value_text(argv[1])) ){
    jsonParseReset(&x);
    return;
  }
  pResult = jsonMergePatch(&x, 0, y.aNode);
  assert( pResult!=0 || x.oom );
  if( pResult ){
    jsonReturnJson(pResult, ctx, 0);
  }else{
    sqlite3_result_error_nomem(ctx);
  }
  jsonParseReset(&x);
  jsonParseReset(&y);
}